

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2polyline_measures.cc
# Opt level: O3

S1Angle __thiscall S2::GetLength(S2 *this,S2PointSpan polyline)

{
  undefined1 *puVar1;
  S1Angle SVar2;
  S1Angle local_20;
  
  SVar2.radians_ = 0.0;
  if ((pointer)0x1 < polyline.ptr_) {
    puVar1 = (undefined1 *)((long)polyline.ptr_[-1].c_ + 0x17);
    do {
      S1Angle::S1Angle(&local_20,(S2Point *)this,(S2Point *)(this + 0x18));
      SVar2.radians_ = SVar2.radians_ + local_20.radians_;
      puVar1 = puVar1 + -1;
      this = this + 0x18;
    } while (puVar1 != (undefined1 *)0x0);
  }
  return (S1Angle)SVar2.radians_;
}

Assistant:

S1Angle GetLength(S2PointSpan polyline) {
  S1Angle length;
  for (int i = 1; i < polyline.size(); ++i) {
    length += S1Angle(polyline[i - 1], polyline[i]);
  }
  return length;
}